

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O2

Rwr_Node_t *
Rwr_ManTryNode(Rwr_Man_t *p,Rwr_Node_t *p0,Rwr_Node_t *p1,int fExor,int Level,int Volume)

{
  long lVar1;
  uint uVar2;
  int *Entry;
  Rwr_Node_t *extraout_RAX;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  long *plVar7;
  ulong uVar8;
  Rwr_Node_t *pRVar3;
  
  p->nConsidered = p->nConsidered + 1;
  if (fExor == 0) {
    if (((ulong)p0 & 1) == 0) {
      uVar4 = *(uint *)&p0->field_0xe;
    }
    else {
      uVar4 = ~*(uint *)(((ulong)p0 & 0xfffffffffffffffe) + 0xe);
    }
    if (((ulong)p1 & 1) == 0) {
      uVar2 = *(uint *)&p1->field_0xe;
    }
    else {
      uVar2 = ~*(uint *)(((ulong)p1 & 0xfffffffffffffffe) + 0xe);
    }
    uVar2 = uVar2 & uVar4;
  }
  else {
    uVar2 = *(uint *)&p1->field_0xe ^ *(uint *)&p0->field_0xe;
  }
  pRVar3 = (Rwr_Node_t *)(ulong)uVar2;
  uVar8 = (ulong)pRVar3 & 0xffff;
  if ((Level < 3) || (p->pPractical[p->puCanons[uVar8]] != '\0')) {
    plVar6 = (long *)((ulong)((uint)uVar8 * 8) + (long)p->pTable);
    plVar7 = plVar6;
    while (lVar1 = *plVar7, lVar1 != 0) {
      uVar4 = *(uint *)(lVar1 + 0xe);
      uVar5 = uVar4 >> 0x18 & 0x3f;
      if ((uVar5 < (uint)Level) && ((uVar4 >> 0x10 & 0xff) < (uint)Volume)) {
        return pRVar3;
      }
      if ((uVar5 == Level) && ((uVar4 >> 0x10 & 0xff) < (uint)Volume)) {
        return pRVar3;
      }
      plVar7 = (long *)(lVar1 + 0x28);
    }
    if ((*plVar6 == 0) && (p->puCanons[uVar8] == (unsigned_short)uVar2)) {
      p->nClasses = p->nClasses + 1;
    }
    Entry = (int *)Extra_MmFixedEntryFetch(p->pMmNode);
    *Entry = p->vForest->nSize;
    Entry[1] = 0;
    *(uint *)((long)Entry + 0xe) =
         (uint)uVar8 | fExor << 0x1f | (Volume & 0xffU) << 0x10 | (Level & 0x3fU) << 0x18;
    *(Rwr_Node_t **)(Entry + 6) = p0;
    *(Rwr_Node_t **)(Entry + 8) = p1;
    Entry[10] = 0;
    Entry[0xb] = 0;
    Vec_PtrPush(p->vForest,Entry);
    *plVar7 = (long)Entry;
    pRVar3 = extraout_RAX;
  }
  return pRVar3;
}

Assistant:

Rwr_Node_t * Rwr_ManTryNode( Rwr_Man_t * p, Rwr_Node_t * p0, Rwr_Node_t * p1, int fExor, int Level, int Volume )
{
    Rwr_Node_t * pOld, * pNew, ** ppPlace;
    unsigned uTruth;
    // compute truth table, level, volume
    p->nConsidered++;
    if ( fExor )
    {
//        printf( "Considering EXOR of %d and %d.\n", p0->Id, p1->Id );
        uTruth = (p0->uTruth ^ p1->uTruth);
    }
    else
        uTruth = (Rwr_IsComplement(p0)? ~Rwr_Regular(p0)->uTruth : Rwr_Regular(p0)->uTruth) & 
                 (Rwr_IsComplement(p1)? ~Rwr_Regular(p1)->uTruth : Rwr_Regular(p1)->uTruth) & 0xFFFF;
    // skip non-practical classes
    if ( Level > 2 && !p->pPractical[p->puCanons[uTruth]] )
        return NULL;
    // enumerate through the nodes with the same canonical form
    ppPlace = p->pTable + uTruth;
    for ( pOld = *ppPlace; pOld; ppPlace = &pOld->pNext, pOld = pOld->pNext )
    {
        if ( pOld->Level <  (unsigned)Level && pOld->Volume < (unsigned)Volume )
            return NULL;
        if ( pOld->Level == (unsigned)Level && pOld->Volume < (unsigned)Volume )
            return NULL;
//        if ( pOld->Level <  (unsigned)Level && pOld->Volume == (unsigned)Volume )
//            return NULL;
    }
/*
    // enumerate through the nodes with the opposite polarity
    for ( pOld = p->pTable[~uTruth & 0xFFFF]; pOld; pOld = pOld->pNext )
    {
        if ( pOld->Level <  (unsigned)Level && pOld->Volume < (unsigned)Volume )
            return NULL;
        if ( pOld->Level == (unsigned)Level && pOld->Volume < (unsigned)Volume )
            return NULL;
//        if ( pOld->Level <  (unsigned)Level && pOld->Volume == (unsigned)Volume )
//            return NULL;
    }
*/
    // count the classes
    if ( p->pTable[uTruth] == NULL && p->puCanons[uTruth] == uTruth )
        p->nClasses++;
    // create the new node
    pNew = (Rwr_Node_t *)Extra_MmFixedEntryFetch( p->pMmNode );
    pNew->Id     = p->vForest->nSize;
    pNew->TravId = 0;
    pNew->uTruth = uTruth;
    pNew->Level  = Level;
    pNew->Volume = Volume;
    pNew->fUsed  = 0;
    pNew->fExor  = fExor;
    pNew->p0     = p0;
    pNew->p1     = p1;
    pNew->pNext  = NULL;
    Vec_PtrPush( p->vForest, pNew );
    *ppPlace     = pNew;
    return pNew;
}